

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

void Ssw_SmlNodeCopyFanin(Ssw_Sml_t *p,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  uint *puVar2;
  Aig_Obj_t *pAVar3;
  uint *puVar4;
  int iVar5;
  int iVar6;
  int local_3c;
  int i;
  int fCompl0;
  int fCompl;
  uint *pSims0;
  uint *pSims;
  int iFrame_local;
  Aig_Obj_t *pObj_local;
  Ssw_Sml_t *p_local;
  
  if (p->nFrames <= iFrame) {
    __assert_fail("iFrame < p->nFrames",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x327,"void Ssw_SmlNodeCopyFanin(Ssw_Sml_t *, Aig_Obj_t *, int)");
  }
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x328,"void Ssw_SmlNodeCopyFanin(Ssw_Sml_t *, Aig_Obj_t *, int)");
  }
  iVar1 = Aig_ObjIsCo(pObj);
  if (iVar1 == 0) {
    __assert_fail("Aig_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x329,"void Ssw_SmlNodeCopyFanin(Ssw_Sml_t *, Aig_Obj_t *, int)");
  }
  if ((iFrame != 0) && (p->nWordsTotal <= p->nWordsFrame)) {
    __assert_fail("iFrame == 0 || p->nWordsFrame < p->nWordsTotal",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x32a,"void Ssw_SmlNodeCopyFanin(Ssw_Sml_t *, Aig_Obj_t *, int)");
  }
  puVar2 = Ssw_ObjSim(p,pObj->Id);
  iVar5 = p->nWordsFrame * iFrame;
  pAVar3 = Aig_ObjFanin0(pObj);
  puVar4 = Ssw_ObjSim(p,pAVar3->Id);
  iVar6 = p->nWordsFrame * iFrame;
  pAVar3 = Aig_ObjChild0(pObj);
  iVar1 = Aig_ObjPhaseReal(pAVar3);
  if (iVar1 == 0) {
    for (local_3c = 0; local_3c < p->nWordsFrame; local_3c = local_3c + 1) {
      puVar2[(long)iVar5 + (long)local_3c] = puVar4[(long)iVar6 + (long)local_3c];
    }
  }
  else {
    for (local_3c = 0; local_3c < p->nWordsFrame; local_3c = local_3c + 1) {
      puVar2[(long)iVar5 + (long)local_3c] = puVar4[(long)iVar6 + (long)local_3c] ^ 0xffffffff;
    }
  }
  return;
}

Assistant:

void Ssw_SmlNodeCopyFanin( Ssw_Sml_t * p, Aig_Obj_t * pObj, int iFrame )
{
    unsigned * pSims, * pSims0;
    int fCompl, fCompl0, i;
    assert( iFrame < p->nFrames );
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsCo(pObj) );
    assert( iFrame == 0 || p->nWordsFrame < p->nWordsTotal );
    // get hold of the simulation information
    pSims  = Ssw_ObjSim(p, pObj->Id) + p->nWordsFrame * iFrame;
    pSims0 = Ssw_ObjSim(p, Aig_ObjFanin0(pObj)->Id) + p->nWordsFrame * iFrame;
    // get complemented attributes of the children using their random info
    fCompl  = pObj->fPhase;
    fCompl0 = Aig_ObjPhaseReal(Aig_ObjChild0(pObj));
    // copy information as it is
    if ( fCompl0 )
        for ( i = 0; i < p->nWordsFrame; i++ )
            pSims[i] = ~pSims0[i];
    else
        for ( i = 0; i < p->nWordsFrame; i++ )
            pSims[i] = pSims0[i];
}